

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsScissorTests.cpp
# Opt level: O3

TestNode *
deqp::gls::Functional::ScissorTestInternal::createFramebufferClearTest
          (TestContext *testCtx,RenderContext *renderCtx,char *name,char *desc,ClearType clearType)

{
  TestNode *this;
  
  this = (TestNode *)operator_new(0x80);
  tcu::TestCase::TestCase((TestCase *)this,testCtx,name,desc);
  ((TestNode *)&this->_vptr_TestNode)->_vptr_TestNode = (_func_int **)&PTR__TestCase_0217af28;
  ((TestNode *)&this[1]._vptr_TestNode)->_vptr_TestNode = (_func_int **)renderCtx;
  *(ClearType *)&this[1].m_testCtx = clearType;
  return this;
}

Assistant:

tcu::TestNode* createFramebufferClearTest (tcu::TestContext&	testCtx,
										   glu::RenderContext&	renderCtx,
										   const char*			name,
										   const char*			desc,
										   ClearType			clearType)
{
	return new FramebufferClearCase(testCtx, renderCtx, name, desc, clearType);
}